

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundCompoundCollisionAlgorithm::processCollision
          (cbtCompoundCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtCollisionShape *pcVar2;
  cbtCollisionShape *pcVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  cbtHashedSimplePairCache *pcVar6;
  long *plVar7;
  cbtDbvtNode *pcVar8;
  cbtDbvtNode *pcVar9;
  cbtDbvtNode *pcVar10;
  cbtSimplePair *pcVar11;
  undefined8 *puVar12;
  cbtDispatcher *pcVar13;
  cbtVector3 cVar14;
  bool bVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int m;
  long lVar20;
  int i;
  cbtCollisionAlgorithm *algo;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int local_1080;
  cbtVector3 local_1078;
  cbtVector3 local_1068;
  cbtAlignedObjectArray<cbtDbvt::sStkNN> stkStack;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  cbtVector3 local_ff0;
  cbtVector3 local_fe0;
  cbtCollisionShape *local_fd0;
  cbtDbvtAabbMm box;
  cbtCompoundCompoundLeafCallback callback;
  cbtTransform xform;
  cbtPersistentManifold localManifolds [4];
  
  pcVar2 = body0Wrap->m_shape;
  pcVar3 = body1Wrap->m_shape;
  pp_Var4 = pcVar2[3]._vptr_cbtCollisionShape;
  pp_Var5 = pcVar3[3]._vptr_cbtCollisionShape;
  if (pp_Var4 != (_func_int **)0x0 && pp_Var5 != (_func_int **)0x0) {
    if ((pcVar2[3].m_shapeType != this->m_compoundShapeRevision0) ||
       (pcVar3[3].m_shapeType != this->m_compoundShapeRevision1)) {
      removeChildAlgorithms(this);
      this->m_compoundShapeRevision0 = pcVar2[3].m_shapeType;
      this->m_compoundShapeRevision1 = pcVar3[3].m_shapeType;
    }
    callback.m_compound1ColObjWrap =
         (cbtCollisionObjectWrapper *)CONCAT71(callback.m_compound1ColObjWrap._1_7_,1);
    callback.m_compound0ColObjWrap = (cbtCollisionObjectWrapper *)0x0;
    callback.super_ICollide._vptr_ICollide._4_4_ = 0;
    callback.m_numOverlapPairs = 0;
    lVar17 = 0;
    local_fd0 = pcVar2;
    do {
      cbtPersistentManifold::cbtPersistentManifold
                ((cbtPersistentManifold *)
                 ((long)localManifolds[0].m_pointCache[0].reactions_cache + lVar17 + -8));
      lVar17 = lVar17 + 0x3b0;
    } while (lVar17 != 0xec0);
    cbtAlignedObjectArray<cbtPersistentManifold_*>::initializeFromBuffer
              ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)&callback,localManifolds,0,4);
    pcVar6 = this->m_childCollisionAlgorithmCache;
    for (lVar17 = 0; lVar17 < (pcVar6->m_overlappingPairArray).m_size; lVar17 = lVar17 + 1) {
      plVar7 = (long *)(pcVar6->m_overlappingPairArray).m_data[lVar17].field_2.m_userPointer;
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x20))();
        for (lVar20 = 0; lVar20 < callback.super_ICollide._vptr_ICollide._4_4_; lVar20 = lVar20 + 1)
        {
          if (((cbtPersistentManifold *)(&(callback.m_compound0ColObjWrap)->m_parent)[lVar20])->
              m_cachedPoints != 0) {
            resultOut->m_manifoldPtr =
                 (cbtPersistentManifold *)(&(callback.m_compound0ColObjWrap)->m_parent)[lVar20];
            cbtManifoldResult::refreshContactPoints(resultOut);
            resultOut->m_manifoldPtr = (cbtPersistentManifold *)0x0;
          }
        }
        xform.m_basis.m_el[0].m_floats[0] = 0.0;
        xform.m_basis.m_el[0].m_floats[1] = 0.0;
        cbtAlignedObjectArray<cbtPersistentManifold_*>::resize
                  ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)&callback,0,
                   (cbtPersistentManifold **)&xform);
      }
    }
    cbtAlignedObjectArray<cbtPersistentManifold_*>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)&callback);
    callback.m_childCollisionAlgorithmCache = this->m_childCollisionAlgorithmCache;
    callback.m_dispatcher =
         (this->super_cbtCompoundCollisionAlgorithm).super_cbtActivatingCollisionAlgorithm.
         super_cbtCollisionAlgorithm.m_dispatcher;
    callback.m_sharedManifold = (this->super_cbtCompoundCollisionAlgorithm).m_sharedManifold;
    callback.super_ICollide._vptr_ICollide._0_4_ = 0x1194470;
    callback.super_ICollide._vptr_ICollide._4_4_ = 0;
    callback.m_numOverlapPairs = 0;
    callback.m_compound0ColObjWrap = body0Wrap;
    callback.m_compound1ColObjWrap = body1Wrap;
    callback.m_dispatchInfo = dispatchInfo;
    callback.m_resultOut = resultOut;
    cbtTransform::inverse((cbtTransform *)localManifolds,body0Wrap->m_worldTransform);
    cbtTransform::operator*(&xform,(cbtTransform *)localManifolds,body1Wrap->m_worldTransform);
    pcVar8 = (cbtDbvtNode *)*pp_Var4;
    if ((pcVar8 != (cbtDbvtNode *)0x0) &&
       (pcVar9 = (cbtDbvtNode *)*pp_Var5, pcVar9 != (cbtDbvtNode *)0x0)) {
      local_1018._4_4_ = resultOut->m_closestPointDistanceThreshold;
      stkStack.m_ownsMemory = true;
      stkStack.m_data = (sStkNN *)0x0;
      stkStack.m_size = 0;
      stkStack.m_capacity = 0;
      cbtAlignedObjectArray<cbtDbvt::sStkNN>::initializeFromBuffer
                (&stkStack,localManifolds,0x80,0x80);
      (stkStack.m_data)->a = pcVar8;
      (stkStack.m_data)->b = pcVar9;
      local_1018._0_4_ = local_1018._4_4_;
      fStack_1010 = (float)local_1018._4_4_;
      fStack_100c = (float)local_1018._4_4_;
      local_1080 = 0x7c;
      iVar18 = 1;
      do {
        lVar20 = (long)iVar18;
        lVar17 = lVar20 + -1;
        pcVar8 = stkStack.m_data[lVar17].b;
        pcVar9 = stkStack.m_data[lVar17].a;
        cbtTransformAabb((cbtVector3 *)pcVar8,&(pcVar8->volume).mx,0.0,&xform,&local_1068,
                         &local_1078);
        auVar21._8_8_ = 0;
        auVar21._0_4_ = local_1068.m_floats[0];
        auVar21._4_4_ = local_1068.m_floats[1];
        iVar19 = iVar18 + -1;
        auVar21 = vsubps_avx(auVar21,_local_1018);
        local_1068.m_floats._0_8_ = vmovlps_avx(auVar21);
        local_1068.m_floats[2] = local_1068.m_floats[2] - (float)local_1018._4_4_;
        auVar22._0_4_ = (float)local_1018._4_4_ + local_1078.m_floats[0];
        auVar22._4_4_ = (float)local_1018._4_4_ + local_1078.m_floats[1];
        auVar22._8_4_ = (float)local_1018._4_4_ + 0.0;
        auVar22._12_4_ = (float)local_1018._4_4_ + 0.0;
        box.mi.m_floats[3] = local_1068.m_floats[3];
        box.mi.m_floats[2] = local_1068.m_floats[2];
        local_1078.m_floats._0_8_ = vmovlps_avx(auVar22);
        local_1078.m_floats[2] = (float)local_1018._4_4_ + local_1078.m_floats[2];
        box.mx.m_floats[2] = local_1078.m_floats[2];
        box.mx.m_floats[0] = local_1078.m_floats[0];
        box.mx.m_floats[1] = local_1078.m_floats[1];
        box.mx.m_floats[3] = local_1078.m_floats[3];
        box.mi.m_floats._0_8_ = local_1068.m_floats._0_8_;
        bVar15 = Intersect(&pcVar9->volume,&box);
        if (bVar15) {
          if (local_1080 < iVar19) {
            cbtAlignedObjectArray<cbtDbvt::sStkNN>::resize
                      (&stkStack,stkStack.m_size * 2,(sStkNN *)&box);
            local_1080 = stkStack.m_size + -4;
          }
          lVar16 = *(long *)((long)&pcVar8->field_2 + 8);
          if ((pcVar9->field_2).childs[1] == (cbtDbvtNode *)0x0) {
            if (lVar16 == 0) {
              (**(code **)(CONCAT44(callback.super_ICollide._vptr_ICollide._4_4_,
                                    callback.super_ICollide._vptr_ICollide._0_4_) + 0x10))
                        (&callback,pcVar9,pcVar8);
            }
            else {
              pcVar10 = (pcVar8->field_2).childs[0];
              stkStack.m_data[lVar17].a = pcVar9;
              stkStack.m_data[lVar17].b = pcVar10;
              iVar19 = iVar18 + 1;
              pcVar8 = *(cbtDbvtNode **)((long)&pcVar8->field_2 + 8);
              stkStack.m_data[lVar20].a = pcVar9;
              stkStack.m_data[lVar20].b = pcVar8;
            }
          }
          else if (lVar16 == 0) {
            stkStack.m_data[lVar17].a = (pcVar9->field_2).childs[0];
            stkStack.m_data[lVar17].b = pcVar8;
            iVar19 = iVar18 + 1;
            stkStack.m_data[lVar20].a = (pcVar9->field_2).childs[1];
            stkStack.m_data[lVar20].b = pcVar8;
          }
          else {
            pcVar10 = (pcVar8->field_2).childs[0];
            stkStack.m_data[lVar17].a = (pcVar9->field_2).childs[0];
            stkStack.m_data[lVar17].b = pcVar10;
            iVar19 = iVar18 + 3;
            pcVar10 = (pcVar8->field_2).childs[0];
            stkStack.m_data[lVar20].a = (pcVar9->field_2).childs[1];
            stkStack.m_data[lVar20].b = pcVar10;
            pcVar10 = *(cbtDbvtNode **)((long)&pcVar8->field_2 + 8);
            stkStack.m_data[lVar20 + 1].a = (pcVar9->field_2).childs[0];
            stkStack.m_data[lVar20 + 1].b = pcVar10;
            pcVar8 = *(cbtDbvtNode **)((long)&pcVar8->field_2 + 8);
            stkStack.m_data[lVar20 + 2].a = (pcVar9->field_2).childs[1];
            stkStack.m_data[lVar20 + 2].b = pcVar8;
          }
        }
        iVar18 = iVar19;
      } while (iVar19 != 0);
      cbtAlignedObjectArray<cbtDbvt::sStkNN>::~cbtAlignedObjectArray(&stkStack);
    }
    pcVar6 = this->m_childCollisionAlgorithmCache;
    stkStack.m_ownsMemory = true;
    stkStack.m_data = (sStkNN *)0x0;
    stkStack.m_size = 0;
    stkStack.m_capacity = 0;
    lVar17 = 0;
    for (lVar20 = 0; lVar20 < (pcVar6->m_overlappingPairArray).m_size; lVar20 = lVar20 + 1) {
      pcVar11 = (pcVar6->m_overlappingPairArray).m_data;
      puVar12 = *(undefined8 **)((long)&pcVar11->field_2 + lVar17);
      if (puVar12 != (undefined8 *)0x0) {
        lVar16 = (long)*(int *)((long)&pcVar11->m_indexA + lVar17) * 0x58;
        plVar7 = *(long **)((long)local_fd0[1].m_userPointer + lVar16 + 0x40);
        cbtTransform::operator*
                  ((cbtTransform *)&box,body0Wrap->m_worldTransform,
                   (cbtTransform *)((long)local_fd0[1].m_userPointer + lVar16));
        cVar14 = box.mx;
        localManifolds[0].super_cbtTypedObject.m_objectType = (int)box.mi.m_floats[0];
        localManifolds[0]._4_4_ = box.mi.m_floats[1];
        localManifolds[0].m_pointCache[0].reactions_cache[0] = box.mi.m_floats[2];
        localManifolds[0].m_pointCache[0].reactions_cache[1] = box.mi.m_floats[3];
        localManifolds[0].m_pointCache[0].reactions_cache[2] = box.mx.m_floats[0];
        localManifolds[0].m_pointCache[0].reactions_cache[3] = box.mx.m_floats[1];
        localManifolds[0].m_pointCache[0].reactions_cache[4] = box.mx.m_floats[2];
        localManifolds[0].m_pointCache[0].reactions_cache[5] = box.mx.m_floats[3];
        box.mx = cVar14;
        (**(code **)(*plVar7 + 0x10))(plVar7,localManifolds,&local_1068,&local_1078);
        fVar1 = resultOut->m_closestPointDistanceThreshold;
        auVar27._4_4_ = fVar1;
        auVar27._0_4_ = fVar1;
        auVar27._8_4_ = fVar1;
        auVar27._12_4_ = fVar1;
        auVar23._8_8_ = 0;
        auVar23._0_4_ = local_1068.m_floats[0];
        auVar23._4_4_ = local_1068.m_floats[1];
        auVar21 = vsubps_avx(auVar23,auVar27);
        local_1068.m_floats._0_8_ = vmovlps_avx(auVar21);
        local_1068.m_floats[2] = local_1068.m_floats[2] - fVar1;
        auVar24._0_4_ = fVar1 + local_1078.m_floats[0];
        auVar24._4_4_ = fVar1 + local_1078.m_floats[1];
        auVar24._8_4_ = fVar1 + 0.0;
        auVar24._12_4_ = fVar1 + 0.0;
        local_1078.m_floats._0_8_ = vmovlps_avx(auVar24);
        local_1078.m_floats[2] = fVar1 + local_1078.m_floats[2];
        lVar16 = (long)*(int *)((long)&((pcVar6->m_overlappingPairArray).m_data)->m_indexB + lVar17)
                 * 0x58;
        plVar7 = *(long **)((long)pcVar3[1].m_userPointer + lVar16 + 0x40);
        cbtTransform::operator*
                  ((cbtTransform *)&box,body1Wrap->m_worldTransform,
                   (cbtTransform *)((long)pcVar3[1].m_userPointer + lVar16));
        cVar14 = box.mx;
        localManifolds[0].super_cbtTypedObject.m_objectType = (int)box.mi.m_floats[0];
        localManifolds[0]._4_4_ = box.mi.m_floats[1];
        localManifolds[0].m_pointCache[0].reactions_cache[0] = box.mi.m_floats[2];
        localManifolds[0].m_pointCache[0].reactions_cache[1] = box.mi.m_floats[3];
        localManifolds[0].m_pointCache[0].reactions_cache[2] = box.mx.m_floats[0];
        localManifolds[0].m_pointCache[0].reactions_cache[3] = box.mx.m_floats[1];
        localManifolds[0].m_pointCache[0].reactions_cache[4] = box.mx.m_floats[2];
        localManifolds[0].m_pointCache[0].reactions_cache[5] = box.mx.m_floats[3];
        box.mx = cVar14;
        (**(code **)(*plVar7 + 0x10))(plVar7,localManifolds,&local_fe0,&local_ff0);
        auVar25._8_8_ = 0;
        auVar25._0_4_ = local_fe0.m_floats[0];
        auVar25._4_4_ = local_fe0.m_floats[1];
        auVar21 = vsubps_avx(auVar25,auVar27);
        local_fe0.m_floats._0_8_ = vmovlps_avx(auVar21);
        local_fe0.m_floats[2] = local_fe0.m_floats[2] - fVar1;
        auVar26._0_4_ = fVar1 + local_ff0.m_floats[0];
        auVar26._4_4_ = fVar1 + local_ff0.m_floats[1];
        auVar26._8_4_ = fVar1 + 0.0;
        auVar26._12_4_ = fVar1 + 0.0;
        local_ff0.m_floats._0_8_ = vmovlps_avx(auVar26);
        local_ff0.m_floats[2] = fVar1 + local_ff0.m_floats[2];
        bVar15 = TestAabbAgainstAabb2(&local_1068,&local_1078,&local_fe0,&local_ff0);
        if (!bVar15) {
          (**(code **)*puVar12)(puVar12);
          pcVar13 = (this->super_cbtCompoundCollisionAlgorithm).
                    super_cbtActivatingCollisionAlgorithm.super_cbtCollisionAlgorithm.m_dispatcher;
          (*pcVar13->_vptr_cbtDispatcher[0xf])(pcVar13,puVar12);
          localManifolds[0]._0_8_ =
               *(undefined8 *)((long)&((pcVar6->m_overlappingPairArray).m_data)->m_indexA + lVar17);
          localManifolds[0].m_pointCache[0].reactions_cache[0] = 0.0;
          localManifolds[0].m_pointCache[0].reactions_cache[1] = 0.0;
          cbtAlignedObjectArray<cbtSimplePair>::push_back
                    (&this->m_removePairs,(cbtSimplePair *)localManifolds);
        }
      }
      lVar17 = lVar17 + 0x10;
    }
    lVar17 = 4;
    for (lVar20 = 0; lVar20 < (this->m_removePairs).m_size; lVar20 = lVar20 + 1) {
      pcVar11 = (this->m_removePairs).m_data;
      (*this->m_childCollisionAlgorithmCache->_vptr_cbtHashedSimplePairCache[2])
                (this->m_childCollisionAlgorithmCache,(ulong)*(uint *)((long)pcVar11 + lVar17 + -4),
                 (ulong)*(uint *)((long)&pcVar11->m_indexA + lVar17));
      lVar17 = lVar17 + 0x10;
    }
    cbtAlignedObjectArray<cbtSimplePair>::clear(&this->m_removePairs);
    cbtAlignedObjectArray<cbtPersistentManifold_*>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)&stkStack);
    return;
  }
  cbtCompoundCollisionAlgorithm::processCollision
            (&this->super_cbtCompoundCollisionAlgorithm,body0Wrap,body1Wrap,dispatchInfo,resultOut);
  return;
}

Assistant:

void cbtCompoundCompoundCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* col0ObjWrap = body0Wrap;
	const cbtCollisionObjectWrapper* col1ObjWrap = body1Wrap;

	cbtAssert(col0ObjWrap->getCollisionShape()->isCompound());
	cbtAssert(col1ObjWrap->getCollisionShape()->isCompound());
	const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(col0ObjWrap->getCollisionShape());
	const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(col1ObjWrap->getCollisionShape());

	const cbtDbvt* tree0 = compoundShape0->getDynamicAabbTree();
	const cbtDbvt* tree1 = compoundShape1->getDynamicAabbTree();
	if (!tree0 || !tree1)
	{
		return cbtCompoundCollisionAlgorithm::processCollision(body0Wrap, body1Wrap, dispatchInfo, resultOut);
	}
	///cbtCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if ((compoundShape0->getUpdateRevision() != m_compoundShapeRevision0) || (compoundShape1->getUpdateRevision() != m_compoundShapeRevision1))
	{
		///clear all
		removeChildAlgorithms();
		m_compoundShapeRevision0 = compoundShape0->getUpdateRevision();
		m_compoundShapeRevision1 = compoundShape1->getUpdateRevision();
	}

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, cbtCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the cbtCollisionAlgorithm
	{
		int i;
		cbtManifoldArray manifoldArray;
#ifdef USE_LOCAL_STACK
		cbtPersistentManifold localManifolds[4];
		manifoldArray.initializeFromBuffer(&localManifolds, 0, 4);
#endif
		cbtSimplePairArray& pairs = m_childCollisionAlgorithmCache->getOverlappingPairArray();
		for (i = 0; i < pairs.size(); i++)
		{
			if (pairs[i].m_userPointer)
			{
				cbtCollisionAlgorithm* algo = (cbtCollisionAlgorithm*)pairs[i].m_userPointer;
				algo->getAllContactManifolds(manifoldArray);
				for (int m = 0; m < manifoldArray.size(); m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	cbtCompoundCompoundLeafCallback callback(col0ObjWrap, col1ObjWrap, this->m_dispatcher, dispatchInfo, resultOut, this->m_childCollisionAlgorithmCache, m_sharedManifold);

	const cbtTransform xform = col0ObjWrap->getWorldTransform().inverse() * col1ObjWrap->getWorldTransform();
	MycollideTT(tree0->m_root, tree1->m_root, xform, &callback, resultOut->m_closestPointDistanceThreshold);

	//printf("#compound-compound child/leaf overlap =%d                      \r",callback.m_numOverlapPairs);

	//remove non-overlapping child pairs

	{
		cbtAssert(m_removePairs.size() == 0);

		//iterate over all children, perform an AABB check inside ProcessChildShape
		cbtSimplePairArray& pairs = m_childCollisionAlgorithmCache->getOverlappingPairArray();

		int i;
		cbtManifoldArray manifoldArray;

		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;

		for (i = 0; i < pairs.size(); i++)
		{
			if (pairs[i].m_userPointer)
			{
				cbtCollisionAlgorithm* algo = (cbtCollisionAlgorithm*)pairs[i].m_userPointer;

				{
					const cbtCollisionShape* childShape0 = 0;

					cbtTransform newChildWorldTrans0;
					childShape0 = compoundShape0->getChildShape(pairs[i].m_indexA);
					const cbtTransform& childTrans0 = compoundShape0->getChildTransform(pairs[i].m_indexA);
					newChildWorldTrans0 = col0ObjWrap->getWorldTransform() * childTrans0;
					childShape0->getAabb(newChildWorldTrans0, aabbMin0, aabbMax0);
				}
				cbtVector3 thresholdVec(resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold);
				aabbMin0 -= thresholdVec;
				aabbMax0 += thresholdVec;
				{
					const cbtCollisionShape* childShape1 = 0;
					cbtTransform newChildWorldTrans1;

					childShape1 = compoundShape1->getChildShape(pairs[i].m_indexB);
					const cbtTransform& childTrans1 = compoundShape1->getChildTransform(pairs[i].m_indexB);
					newChildWorldTrans1 = col1ObjWrap->getWorldTransform() * childTrans1;
					childShape1->getAabb(newChildWorldTrans1, aabbMin1, aabbMax1);
				}

				aabbMin1 -= thresholdVec;
				aabbMax1 += thresholdVec;

				if (!TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
				{
					algo->~cbtCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(algo);
					m_removePairs.push_back(cbtSimplePair(pairs[i].m_indexA, pairs[i].m_indexB));
				}
			}
		}
		for (int i = 0; i < m_removePairs.size(); i++)
		{
			m_childCollisionAlgorithmCache->removeOverlappingPair(m_removePairs[i].m_indexA, m_removePairs[i].m_indexB);
		}
		m_removePairs.clear();
	}
}